

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O2

void __thiscall re2c::Cases::~Cases(Cases *this)

{
  Case *pCVar1;
  State *pSVar2;
  long lVar3;
  
  pCVar1 = this->cases;
  if (pCVar1 != (Case *)0x0) {
    pSVar2 = pCVar1[-1].to;
    if (pSVar2 != (State *)0x0) {
      lVar3 = (long)pSVar2 << 5;
      do {
        std::
        _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)((long)&pCVar1[-1].ranges.
                                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pCVar1[-1].to,(long)pSVar2 << 5 | 8);
    return;
  }
  return;
}

Assistant:

Cases::~Cases ()
{
	delete [] cases;
}